

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

void __thiscall
sisl::cartesian_cubic<float>::set_extension_type
          (cartesian_cubic<float> *this,LatticeExtensionType *e,LatticeRegionShift *s)

{
  undefined8 *puVar1;
  LatticeRegionShift *s_local;
  LatticeExtensionType *e_local;
  cartesian_cubic<float> *this_local;
  
  if ((*s == NoShift) && (*e == ForceZero)) {
    this->m_Shift = *s;
    this->m_Extension = *e;
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "Not implemented";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void set_extension_type(const LatticeExtensionType &e,
                                        const LatticeRegionShift &s) {
            // Check validity of the extension type
            if(s == LatticeRegionShift::NoShift && e == LatticeExtensionType::ForceZero) {
                m_Shift = s;
                m_Extension = e;
            }
            else 
                throw "Not implemented";
        }